

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslateEH.cpp
# Opt level: O0

void wasm::anon_unknown_157::TranslateToExnref::ExnrefLocalAssigner::scan
               (ExnrefLocalAssigner *self,Expression **currp)

{
  Expression *this;
  bool bVar1;
  Try *pTVar2;
  Try *tryy_1;
  Try *tryy;
  Expression *curr;
  Expression **currp_local;
  ExnrefLocalAssigner *self_local;
  
  this = *currp;
  pTVar2 = Expression::dynCast<wasm::Try>(this);
  if ((pTVar2 != (Try *)0x0) &&
     (bVar1 = TargetTryLabelScanner::isTargetedByRethrows(self->labelScanner,pTVar2), bVar1)) {
    Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
                *)self,decrementRethrowTryDepth,currp);
  }
  PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
  ::scan(self,currp);
  pTVar2 = Expression::dynCast<wasm::Try>(this);
  if ((pTVar2 != (Try *)0x0) &&
     (bVar1 = TargetTryLabelScanner::isTargetedByRethrows(self->labelScanner,pTVar2), bVar1)) {
    Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
                *)self,incrementRethrowTryDepth,currp);
  }
  return;
}

Assistant:

static void scan(ExnrefLocalAssigner* self, Expression** currp) {
      auto* curr = *currp;
      if (auto* tryy = curr->dynCast<Try>()) {
        if (self->labelScanner->isTargetedByRethrows(tryy)) {
          self->pushTask(decrementRethrowTryDepth, currp);
        }
      }
      PostWalker<ExnrefLocalAssigner>::scan(self, currp);
      if (auto* tryy = curr->dynCast<Try>()) {
        if (self->labelScanner->isTargetedByRethrows(tryy)) {
          self->pushTask(incrementRethrowTryDepth, currp);
        }
      }
    }